

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void gen_laguerre_ss_compute(int order,double alpha,double *xtab,double *weight)

{
  double *pdVar1;
  double *b;
  double *c;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double local_80;
  double dp2;
  double p1;
  double *local_68;
  double *local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double xval;
  
  local_48 = (double)CONCAT44(local_48._4_4_,order);
  uVar5 = 0xffffffffffffffff;
  if (-1 < order) {
    uVar5 = (long)order * 8;
  }
  local_68 = weight;
  local_60 = xtab;
  local_40 = alpha;
  b = (double *)operator_new__(uVar5);
  c = (double *)operator_new__(uVar5);
  pdVar1 = local_68;
  uVar5 = (ulong)(uint)order;
  if (0 < order) {
    lVar3 = 0;
    do {
      *(double *)((long)b + lVar3 * 4) = (double)((int)lVar3 + 1) + local_40;
      lVar3 = lVar3 + 2;
    } while (uVar5 * 2 - lVar3 != 0);
  }
  iVar4 = local_48._0_4_;
  if (0 < local_48._0_4_) {
    uVar2 = 0;
    do {
      c[uVar2] = ((double)(int)uVar2 + local_40) * (double)(int)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  local_58 = 1.0;
  if (1 < local_48._0_4_) {
    uVar2 = 1;
    do {
      local_58 = local_58 * c[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  local_50 = local_40 + 1.0;
  dVar6 = tgamma(local_50);
  if (0 < iVar4) {
    local_58 = local_58 * dVar6;
    dVar6 = (double)iVar4;
    local_48 = (local_40 * 6.25 + 15.0) / (dVar6 * 2.5 + local_40 * 0.9 + 1.0);
    local_50 = (local_50 * (local_40 * 0.92 + 3.0)) / (local_40 * 1.8 + dVar6 * 2.4 + 1.0);
    p1 = local_40 * 0.3 + 1.0;
    uVar2 = 0;
    do {
      iVar4 = (int)uVar2;
      if (iVar4 == 1) {
        dVar6 = local_38 + local_48;
      }
      else {
        dVar6 = local_50;
        if (iVar4 != 0) {
          dVar6 = (double)(iVar4 + -1);
          dVar6 = (local_38 - local_60[uVar2 - 2]) *
                  (((dVar6 * 1.26 * local_40) / (dVar6 * 3.5 + 1.0) +
                   (dVar6 * 2.55 + 1.0) / (dVar6 * 1.9)) / p1) + local_38;
        }
      }
      local_38 = dVar6;
      gen_laguerre_ss_root(&local_38,order,local_40,&local_80,&dp2,b,c);
      local_60[uVar2] = local_38;
      pdVar1[uVar2] = (local_58 / local_80) / dp2;
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  operator_delete__(b);
  operator_delete__(c);
  return;
}

Assistant:

void gen_laguerre_ss_compute ( int order, double alpha, double xtab[], 
  double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_LAGUERRE_SS_COMPUTE computes a generalized Gauss-Laguerre quadrature rule.
//
//  Discussion:
//
//    In the simplest case, ALPHA is 0, and we are approximating the
//    integral from 0 to +oo of exp(-X) * F(X).  When this is so,
//    it is easy to modify the rule to approximate the integral from
//    A to +oo as well.
//
//    If ALPHA is nonzero, then there is no simple way to extend the
//    rule to approximate the integral from A to +oo.  The simplest
//    procedures would be to approximate the integral from 0 to A.
//
//    If the integral is:
//
//        Integral ( A <= X < +oo ) exp ( - X ) * F(X) dX
//      or
//        Integral ( 0 <= X < +oo ) exp ( - X ) * X^ALPHA * F(X) dX
//
//    then the quadrature rule is:
//
//      EXP ( - A ) * Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( A+XTAB(I) )
//    or
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//
//    If the integral is:
//
//        Integral ( A <= X < +oo ) F(X) dX
//      or
//        Integral ( 0 <= X < +oo ) X^ALPHA * F(X) dX
//
//    then the quadrature rule is:
//
//      exp ( - A ) * Sum ( 1 <= I <= ORDER ) 
//        WEIGHT(I) * exp(A+XTAB(I)) * F ( A+XTAB(I) )
//    or
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * exp(XTAB(I)) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order of the quadrature rule to be computed.
//    ORDER must be at least 1.
//
//    Input, double ALPHA, the exponent of the X factor.
//    Set ALPHA = 0.0 for the simplest rule.
//    ALPHA must be nonnegative.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double *b;
  double *c;
  double cc;
  double dp2;
  int i;
  double p1;
  double prod;
  double r1;
  double r2;
  double ratio;
  double xval;

  b = new double[order];
  c = new double[order];
//
//  Set the recursion coefficients.
//
  for ( i = 0; i < order; i++ )
  {
    b[i] = ( alpha + double( 2 * i + 1 ) );
  }

  for ( i = 0; i < order; i++ )
  {
    c[i] = double( i ) * ( alpha + double( i ) );
  }
  prod = 1.0;
  for ( i = 1; i < order; i++ )
  {
    prod = prod * c[i];
  }
  cc = tgamma ( alpha + 1.0 ) * prod;

  for ( i = 0; i < order; i++ )
  {
//
//  Compute an estimate for the root.
//
    if ( i == 0 )
    {
      xval = ( 1.0 + alpha ) * ( 3.0+ 0.92 * alpha ) / 
        ( 1.0 + 2.4 * double( order ) + 1.8 * alpha );
    }
    else if ( i == 1 )
    {
      xval = xval + ( 15.0 + 6.25 * alpha ) / 
        ( 1.0 + 0.9 * alpha + 2.5 * double( order ) );
    }
    else
    {
      r1 = ( 1.0 + 2.55 * double( i - 1 ) ) 
        / ( 1.9 * double( i - 1 ) );

      r2 = 1.26 * double( i - 1 ) * alpha / 
        ( 1.0 + 3.5 * double( i - 1 ) );

      ratio = ( r1 + r2 ) / ( 1.0 + 0.3 * alpha );

      xval = xval + ratio * ( xval - xtab[i-2] );
    }
//
//  Use iteration to find the root.
//
    gen_laguerre_ss_root ( &xval, order, alpha, &dp2, &p1, b, c );
//
//  Set the abscissa and weight.
//
    xtab[i] = xval;
    weight[i] = ( cc / dp2 ) / p1;
  }

  delete [] b;
  delete [] c;

  return;
}